

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O2

void Abc_SclSurfaceFree(SC_Surface *p)

{
  Vec_FltErase(&p->vIndex0);
  Vec_FltErase(&p->vIndex1);
  Vec_IntErase(&p->vIndex0I);
  Vec_IntErase(&p->vIndex1I);
  Vec_VecErase((Vec_Vec_t *)&p->vData);
  Vec_VecErase((Vec_Vec_t *)&p->vDataI);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  return;
}

Assistant:

static inline void Abc_SclSurfaceFree( SC_Surface * p )
{
    Vec_FltErase( &p->vIndex0 );
    Vec_FltErase( &p->vIndex1 );
    Vec_IntErase( &p->vIndex0I );
    Vec_IntErase( &p->vIndex1I );
    Vec_VecErase( (Vec_Vec_t *)&p->vData );
    Vec_VecErase( (Vec_Vec_t *)&p->vDataI );
    ABC_FREE( p->pName );
//    ABC_FREE( p );
}